

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O0

amqp_boolean_t amqp_method_has_content(amqp_method_number_t methodNumber)

{
  amqp_method_number_t methodNumber_local;
  amqp_boolean_t local_4;
  
  switch(methodNumber) {
  case 0x3c0028:
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case 0x3c0032:
    local_4 = 1;
    break;
  case 0x3c003c:
    local_4 = 1;
    break;
  case 0x3c0047:
    local_4 = 1;
  }
  return local_4;
}

Assistant:

amqp_boolean_t amqp_method_has_content(amqp_method_number_t methodNumber) {
  switch (methodNumber) {
    case AMQP_BASIC_PUBLISH_METHOD:
      return 1;
    case AMQP_BASIC_RETURN_METHOD:
      return 1;
    case AMQP_BASIC_DELIVER_METHOD:
      return 1;
    case AMQP_BASIC_GET_OK_METHOD:
      return 1;
    default:
      return 0;
  }
}